

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O0

void duckdb_logical_type_set_alias(duckdb_logical_type type,char *alias)

{
  char *in_RSI;
  LogicalType *logical_type;
  string *in_stack_ffffffffffffffb8;
  LogicalType *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,(allocator *)&stack0xffffffffffffffc7);
  duckdb::LogicalType::SetAlias(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return;
}

Assistant:

void duckdb_logical_type_set_alias(duckdb_logical_type type, const char *alias) {
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	logical_type.SetAlias(alias);
}